

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O0

void build_tree_indices<IsoForest>
               (TreesIndexer *indexer,IsoForest *model,int nthreads,bool with_distances)

{
  bool bVar1;
  iterator __lhs;
  byte in_CL;
  TreesIndexer *in_RDI;
  SingleTreeIndex *ind_1;
  iterator __end4;
  iterator __begin4;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range4;
  SingleTreeIndex *ind;
  iterator __end2;
  iterator __begin2;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range2;
  int in_stack_00000114;
  IsoForest *in_stack_00000118;
  TreesIndexer *in_stack_00000120;
  reference in_stack_ffffffffffffff98;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  local_58;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffd8;
  TreesIndexer *in_stack_ffffffffffffffe0;
  
  bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                    (in_stack_ffffffffffffffb0);
  if (!bVar1) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front(in_stack_ffffffffffffffa0)
    ;
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_ffffffffffffffb0);
    if (!bVar1) {
      in_stack_ffffffffffffffd8 =
           std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                     ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                      in_stack_ffffffffffffff98);
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                 in_stack_ffffffffffffff98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                 *)in_stack_ffffffffffffff98), in_stack_ffffffffffffffe0 = in_RDI,
            bVar1) {
        __gnu_cxx::
        __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
        ::operator*((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                     *)&stack0xffffffffffffffd8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ba04);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ba12);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x63ba20);
        __gnu_cxx::
        __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
        ::operator++((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                      *)&stack0xffffffffffffffd8);
      }
    }
  }
  if ((in_CL & 1) == 0) {
    bVar1 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::empty
                      (in_stack_ffffffffffffffb0);
    if (!bVar1) {
      std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::front
                (in_stack_ffffffffffffffa0);
      bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0);
      if (!bVar1) {
        local_58._M_current =
             (SingleTreeIndex *)
             std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
                       ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                        in_stack_ffffffffffffff98);
        __lhs = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                          ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                           in_stack_ffffffffffffff98);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                   *)__lhs._M_current,
                                  (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                                   *)in_stack_ffffffffffffff98), bVar1) {
          in_stack_ffffffffffffff98 =
               __gnu_cxx::
               __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
               ::operator*(&local_58);
          std::vector<double,_std::allocator<double>_>::clear
                    ((vector<double,_std::allocator<double>_> *)0x63baff);
          std::vector<double,_std::allocator<double>_>::clear
                    ((vector<double,_std::allocator<double>_> *)0x63bb0c);
          __gnu_cxx::
          __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
          ::operator++(&local_58);
        }
      }
    }
    build_terminal_node_mappings<IsoForest>
              (in_stack_ffffffffffffffe0,(IsoForest *)in_stack_ffffffffffffffd8._M_current);
  }
  else {
    build_distance_mappings<IsoForest>(in_stack_00000120,in_stack_00000118,in_stack_00000114);
  }
  return;
}

Assistant:

void build_tree_indices(TreesIndexer &indexer, const Model &model, int nthreads, const bool with_distances)
{
    if (!indexer.indices.empty() && !indexer.indices.front().reference_points.empty())
    {
        for (auto &ind : indexer.indices)
        {
            ind.reference_points.clear();
            ind.reference_indptr.clear();
            ind.reference_mapping.clear();
        }
    }

    
    try
    {
        if (with_distances) {
            build_distance_mappings(indexer, model, nthreads);
        }

        else {
            if (!indexer.indices.empty() && !indexer.indices.front().node_distances.empty())
            {
                for (auto &ind : indexer.indices)
                {
                    ind.node_distances.clear();
                    ind.node_depths.clear();
                }
            }

            build_terminal_node_mappings(indexer, model);
        }
    }

    catch (...)
    {
        indexer.indices.clear();
        throw;
    }
}